

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O0

planck_unit_suite_t * planck_unit_new_suite(void)

{
  planck_unit_print_funcs_t print_funcs;
  planck_unit_suite_t *suite_00;
  planck_unit_suite_t *suite;
  
  suite_00 = (planck_unit_suite_t *)malloc(0x38);
  if (suite_00 != (planck_unit_suite_t *)0x0) {
    print_funcs.print_preamble = planck_unit_print_funcs_human.print_preamble;
    print_funcs.print_result = planck_unit_print_funcs_human.print_result;
    print_funcs.print_postamble = planck_unit_print_funcs_human.print_postamble;
    planck_unit_init_suite(suite_00,print_funcs);
  }
  return suite_00;
}

Assistant:

planck_unit_suite_t *
planck_unit_new_suite(
	void
) {
	planck_unit_suite_t *suite;

	suite = malloc(sizeof(planck_unit_suite_t));

	if (NULL == suite) {
		return suite;
	}

	/* Change default output according to which styles are included. */

#if defined(PLANCK_UNIT_OUTPUT_STYLE_JSON)
	planck_unit_init_suite(suite, planck_unit_print_funcs_json);
#elif defined(PLANCK_UNIT_OUTPUT_STYLE_HUMAN)
	planck_unit_init_suite(suite, planck_unit_print_funcs_human);
#elif defined(PLANCK_UNIT_OUTPUT_STYLE_XML)
	planck_unit_init_suite(suite, planck_unit_print_funcs_xml);
#elif defined(PLANCK_UNIT_OUTPUT_STYLE_CONCISE)
	planck_unit_init_suite(suite, planck_unit_print_funcs_concise);
#endif
	return suite;
}